

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall Parser::ExpectToken(Parser *this,Token expected,string *err)

{
  char *pcVar1;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string message;
  Token token;
  string *err_local;
  Token expected_local;
  Parser *this_local;
  
  message.field_2._12_4_ = Lexer::ReadToken(&this->lexer_);
  if (message.field_2._12_4_ == expected) {
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"expected ",&local_71);
    pcVar1 = Lexer::TokenName(expected);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70,pcVar1);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,", got ",&local_c9);
    pcVar1 = Lexer::TokenName(message.field_2._12_4_);
    std::operator+(&local_a8,&local_c8,pcVar1);
    std::__cxx11::string::operator+=((string *)local_50,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pcVar1 = Lexer::TokenErrorHint(expected);
    std::__cxx11::string::operator+=((string *)local_50,pcVar1);
    this_local._7_1_ = Lexer::Error(&this->lexer_,(string *)local_50,err);
    std::__cxx11::string::~string((string *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ExpectToken(Lexer::Token expected, string* err) {
  Lexer::Token token = lexer_.ReadToken();
  if (token != expected) {
    string message = string("expected ") + Lexer::TokenName(expected);
    message += string(", got ") + Lexer::TokenName(token);
    message += Lexer::TokenErrorHint(expected);
    return lexer_.Error(message, err);
  }
  return true;
}